

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::
ZLIBBufferCompressorTest_reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input_Test
::TestBody(ZLIBBufferCompressorTest_reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input_Test
           *this)

{
  string *lhs;
  bool bVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  char *pcVar5;
  AssertionResult gtest_ar_2;
  ByteBuffer compressed2;
  ByteBuffer decompressed2;
  size_t len1;
  ByteBuffer decompressed1;
  ByteBuffer compressed1;
  ZLIBBufferInflator decompressor1;
  ZLIBBufferCompressor compressor1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  AssertHelper local_220;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  AssertHelper local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  internal local_1d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0 [5];
  unsigned_long local_1a8;
  ByteBuffer local_1a0 [48];
  ByteBuffer local_170 [48];
  ZLIBBufferInflator local_140 [120];
  ZLIBBufferCompressor local_c8 [168];
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(local_c8,5);
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress
            ((uchar *)local_c8,
             (ulong)(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p,0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  local_1a8 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_140);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(local_1a0);
  pvVar2 = (void *)bidfx_public_api::tools::ByteBuffer::ToArray();
  lVar3 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pvVar2,lVar3 + (long)pvVar2);
  lhs = &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_1d8,"BIGGER_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",lhs,&local_208)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_208);
    if (local_1d0[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_1d0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_240,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x133,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_240,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_208._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress
              ((uchar *)local_c8,
               (ulong)(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    lVar3 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_240._M_dataplus._M_p = (pointer)(lVar3 * 10);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              (local_1d8,"len2 * 10","len1",(unsigned_long *)&local_240,&local_1a8);
    if (local_1d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_240);
      if (local_1d0[0].ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_1d0[0].ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_220,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x138,pcVar5);
      testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_220);
      if ((long *)local_240._M_dataplus._M_p != (long *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)local_240._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_240._M_dataplus._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate((ByteBuffer *)local_1d8);
    pvVar4 = (void *)bidfx_public_api::tools::ByteBuffer::ToArray();
    lVar3 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,pvVar4,lVar3 + (long)pvVar4);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_220,"BIGGER_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",lhs,
               &local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if (local_220.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_240);
      if (local_218.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_218.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_210,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x13c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_240._M_dataplus._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_218,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,1);
    }
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_1d8);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&local_208);
  }
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,1);
  }
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_1a0);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_140);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_170);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(local_c8);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();
    size_t len1 = compressed1.ReadableBytes();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(BIGGER_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed2 = compressor1.GetCompressed();
    size_t len2 = compressed2.ReadableBytes();
    EXPECT_LT(len2 * 10, len1);

    ByteBuffer decompressed2 = decompressor1.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(BIGGER_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}